

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adopt.c
# Opt level: O1

lws * lws_adopt_descriptor_vhost2(lws *new_wsi,lws_adoption_type type,lws_sock_file_fd_type fd)

{
  byte *pbVar1;
  uint8_t uVar2;
  lws_vhost *plVar3;
  _func_int_lws_ptr *p_Var4;
  int iVar5;
  lws_log_cx *cx;
  char *format;
  uint8_t uVar6;
  
  iVar5 = lws_plat_set_nonblocking(fd.sockfd);
  if ((type & LWS_ADOPT_SOCKET) == LWS_ADOPT_RAW_FILE_DESC) {
    if (iVar5 != 0) {
      cx = lwsl_wsi_get_cx(new_wsi);
      format = "unable to set filefd nonblocking";
      goto LAB_00129bf1;
    }
LAB_00129c2a:
    new_wsi->desc = fd;
    plVar3 = (new_wsi->a).vhost;
    if (((plVar3 == (lws_vhost *)0x0) || ((type & LWS_ADOPT_SOCKET) == LWS_ADOPT_RAW_FILE_DESC)) ||
       ((plVar3->tls).use_ssl == 0)) {
      type = type & ~LWS_ADOPT_ALLOW_SSL;
    }
    pbVar1 = (byte *)((long)&new_wsi->wsistate + 3);
    *pbVar1 = *pbVar1 | 0x20;
    uVar2 = new_wsi->role_ops->adoption_cb[1];
    uVar6 = '\x13';
    if (uVar2 != '\0') {
      uVar6 = uVar2;
    }
    p_Var4 = ((new_wsi->a).context)->event_loop_ops->sock_accept;
    if ((p_Var4 != (_func_int_lws_ptr *)0x0) && (iVar5 = (*p_Var4)(new_wsi), iVar5 != 0))
    goto LAB_00129c03;
    if ((type & LWS_ADOPT_ALLOW_SSL) == LWS_ADOPT_RAW_FILE_DESC) {
      iVar5 = __insert_wsi_socket_into_fds((new_wsi->a).context,new_wsi);
      if (iVar5 != 0) {
        cx = lwsl_wsi_get_cx(new_wsi);
        format = "fail inserting socket";
        goto LAB_00129bf1;
      }
LAB_00129cff:
      lws_dll2_remove(&new_wsi->vh_awaiting_socket);
      iVar5 = (*((new_wsi->a).protocol)->callback)
                        (new_wsi,(lws_callback_reasons)uVar6,new_wsi->user_space,(void *)0x0,0);
      if (iVar5 == 0) {
        lws_role_call_adoption_bind(new_wsi,type | 0x1000000,((new_wsi->a).protocol)->name);
        lws_cancel_service_pt(new_wsi);
        return new_wsi;
      }
      goto LAB_00129c03;
    }
    iVar5 = lws_server_socket_service_ssl(new_wsi,fd.sockfd,'\0');
    if (iVar5 == 0) goto LAB_00129cff;
    cx = lwsl_wsi_get_cx(new_wsi);
    format = "fail ssl negotiation";
    iVar5 = 8;
  }
  else {
    if (iVar5 == 0) goto LAB_00129c2a;
    cx = lwsl_wsi_get_cx(new_wsi);
    format = "unable to set sockfd %d nonblocking";
LAB_00129bf1:
    iVar5 = 1;
  }
  _lws_log_cx(cx,lws_log_prepend_wsi,new_wsi,iVar5,"lws_adopt_descriptor_vhost2",format);
LAB_00129c03:
  if ((type & LWS_ADOPT_SOCKET) != LWS_ADOPT_RAW_FILE_DESC) {
    lws_close_free_wsi(new_wsi,LWS_CLOSE_STATUS_NOSTATUS,"adopt skt fail");
  }
  return (lws *)0x0;
}

Assistant:

static struct lws *
lws_adopt_descriptor_vhost2(struct lws *new_wsi, lws_adoption_type type,
			    lws_sock_file_fd_type fd)
{
	struct lws_context_per_thread *pt =
			&new_wsi->a.context->pt[(int)new_wsi->tsi];
	int n;

	/* enforce that every fd is nonblocking */

	if (type & LWS_ADOPT_SOCKET) {
		if (lws_plat_set_nonblocking(fd.sockfd)) {
			lwsl_wsi_err(new_wsi, "unable to set sockfd %d nonblocking",
				     fd.sockfd);
			goto fail;
		}
	}
#if !defined(WIN32)
	else
		if (lws_plat_set_nonblocking(fd.filefd)) {
			lwsl_wsi_err(new_wsi, "unable to set filefd nonblocking");
			goto fail;
		}
#endif

	new_wsi->desc = fd;

	if (!LWS_SSL_ENABLED(new_wsi->a.vhost) ||
	    !(type & LWS_ADOPT_SOCKET))
		type &= (unsigned int)~LWS_ADOPT_ALLOW_SSL;

	/*
	 * A new connection was accepted. Give the user a chance to
	 * set properties of the newly created wsi. There's no protocol
	 * selected yet so we issue this to the vhosts's default protocol,
	 * itself by default protocols[0]
	 */
	new_wsi->wsistate |= LWSIFR_SERVER;
	n = LWS_CALLBACK_SERVER_NEW_CLIENT_INSTANTIATED;
	if (new_wsi->role_ops->adoption_cb[lwsi_role_server(new_wsi)])
		n = new_wsi->role_ops->adoption_cb[lwsi_role_server(new_wsi)];

	if (new_wsi->a.context->event_loop_ops->sock_accept)
		if (new_wsi->a.context->event_loop_ops->sock_accept(new_wsi))
			goto fail;

#if LWS_MAX_SMP > 1
	/*
	 * Caution: after this point the wsi is live on its service thread
	 * which may be concurrent to this.  We mark the wsi as still undergoing
	 * init in another pt so the assigned pt leaves it alone.
	 */
	new_wsi->undergoing_init_from_other_pt = 1;
#endif

	if (!(type & LWS_ADOPT_ALLOW_SSL)) {
		lws_pt_lock(pt, __func__);
		if (__insert_wsi_socket_into_fds(new_wsi->a.context, new_wsi)) {
			lws_pt_unlock(pt);
			lwsl_wsi_err(new_wsi, "fail inserting socket");
			goto fail;
		}
		lws_pt_unlock(pt);
	}
#if defined(LWS_WITH_SERVER)
	 else
		if (lws_server_socket_service_ssl(new_wsi, fd.sockfd, 0)) {
			lwsl_wsi_info(new_wsi, "fail ssl negotiation");

			goto fail;
		}
#endif

	lws_vhost_lock(new_wsi->a.vhost);
	/* he has fds visibility now, remove from vhost orphan list */
	lws_dll2_remove(&new_wsi->vh_awaiting_socket);
	lws_vhost_unlock(new_wsi->a.vhost);

	/*
	 *  by deferring callback to this point, after insertion to fds,
	 * lws_callback_on_writable() can work from the callback
	 */
	if ((new_wsi->a.protocol->callback)(new_wsi, (enum lws_callback_reasons)n, new_wsi->user_space,
					  NULL, 0))
		goto fail;

	/* role may need to do something after all adoption completed */

	lws_role_call_adoption_bind(new_wsi, (int)type | _LWS_ADOPT_FINISH,
				    new_wsi->a.protocol->name);

#if defined(LWS_WITH_SERVER) && defined(LWS_WITH_SECURE_STREAMS)
	/*
	 * Did we come from an accepted client connection to a ss server?
	 *
	 * !!! For mux protocols, this will cause an additional inactive ss
	 * representing the nwsi.  Doing that allows us to support both h1
	 * (here) and h2 (at __lws_wsi_server_new())
	 */

	lwsl_wsi_info(new_wsi, "vhost %s", new_wsi->a.vhost->lc.gutag);

	if (lws_adopt_ss_server_accept(new_wsi))
		goto fail;
#endif

#if LWS_MAX_SMP > 1
	/* its actual pt can service it now */

	new_wsi->undergoing_init_from_other_pt = 0;
#endif

	lws_cancel_service_pt(new_wsi);

	return new_wsi;

fail:
	if (type & LWS_ADOPT_SOCKET)
		lws_close_free_wsi(new_wsi, LWS_CLOSE_STATUS_NOSTATUS,
				   "adopt skt fail");

	return NULL;
}